

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::Matcher::DoSaveInnerGroups
          (Matcher *this,int fromGroupId,int toGroupId,bool reset,Char *input,ContStack *contStack)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  GroupInfo *pGVar4;
  char *pcVar5;
  undefined4 *local_48;
  int local_38;
  
  if (fromGroupId < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x10b,"(fromGroupId >= 0)","fromGroupId >= 0");
    if (!bVar2) goto LAB_00d3a35b;
    *puVar3 = 0;
  }
  if (toGroupId < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x10c,"(toGroupId >= 0)","toGroupId >= 0");
    if (!bVar2) goto LAB_00d3a35b;
    *puVar3 = 0;
  }
  if (toGroupId < fromGroupId) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_48 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_48 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x10d,"(fromGroupId <= toGroupId)","fromGroupId <= toGroupId");
    if (!bVar2) goto LAB_00d3a35b;
    *local_48 = 0;
  }
  else {
    local_48 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  local_38 = -1;
  do {
    pGVar4 = GroupIdToGroupInfo(this,fromGroupId);
    if (pGVar4->length == 0xffffffff) {
      if (local_38 < 0) {
        local_38 = fromGroupId;
      }
    }
    else {
      if (-1 < local_38) {
        if (fromGroupId < 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_48 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                             ,0x11f,"(groupId > 0)","groupId > 0");
          if (!bVar2) goto LAB_00d3a35b;
          *local_48 = 0;
        }
        DoSaveInnerGroups_AllUndefined(this,local_38,fromGroupId + -1,input,contStack);
        local_38 = -1;
      }
      pcVar5 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
               Push<UnifiedRegex::RestoreGroupCont>
                         (&contStack->
                           super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
      pcVar5[8] = '\x02';
      *(undefined ***)pcVar5 = &PTR_Print_013e0218;
      *(int *)(pcVar5 + 0xc) = fromGroupId;
      *(GroupInfo *)(pcVar5 + 0x10) = *pGVar4;
      PushStats(this,contStack,input);
      if (reset) {
        pGVar4->length = 0xffffffff;
      }
    }
    fromGroupId = fromGroupId + 1;
  } while (fromGroupId <= toGroupId);
  if (local_38 < 0) {
    return;
  }
  if (toGroupId < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *local_48 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x130,"(toGroupId >= 0)","toGroupId >= 0");
    if (!bVar2) {
LAB_00d3a35b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *local_48 = 0;
  }
  DoSaveInnerGroups_AllUndefined(this,local_38,toGroupId,input,contStack);
  return;
}

Assistant:

void Matcher::DoSaveInnerGroups(
        const int fromGroupId,
        const int toGroupId,
        const bool reset,
        const Char *const input,
        ContStack &contStack)
    {
        Assert(fromGroupId >= 0);
        Assert(toGroupId >= 0);
        Assert(fromGroupId <= toGroupId);

        int undefinedRangeFromId = -1;
        int groupId = fromGroupId;
        do
        {
            GroupInfo *const groupInfo = GroupIdToGroupInfo(groupId);
            if (groupInfo->IsUndefined())
            {
                if (undefinedRangeFromId < 0)
                {
                    undefinedRangeFromId = groupId;
                }
                continue;
            }

            if (undefinedRangeFromId >= 0)
            {
                Assert(groupId > 0);
                DoSaveInnerGroups_AllUndefined(undefinedRangeFromId, groupId - 1, input, contStack);
                undefinedRangeFromId = -1;
            }

            PUSH(contStack, RestoreGroupCont, groupId, *groupInfo);
#if ENABLE_REGEX_CONFIG_OPTIONS
            PushStats(contStack, input);
#endif

            if (reset)
            {
                groupInfo->Reset();
            }
        } while (++groupId <= toGroupId);
        if (undefinedRangeFromId >= 0)
        {
            Assert(toGroupId >= 0);
            DoSaveInnerGroups_AllUndefined(undefinedRangeFromId, toGroupId, input, contStack);
        }
    }